

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O0

void __thiscall
CcsTest_InterpolationIsDoneAtLoadTime_Test::TestBody
          (CcsTest_InterpolationIsDoneAtLoadTime_Test *this)

{
  bool bVar1;
  string *psVar2;
  char *pcVar3;
  AssertHelper local_298;
  Message local_290;
  allocator local_281;
  string local_280;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_1;
  Message local_248;
  allocator local_239;
  string local_238;
  undefined1 local_218 [8];
  AssertionResult gtest_ar;
  CcsContext ctx;
  string local_1f0;
  allocator local_1b9;
  string local_1b8 [32];
  istringstream local_198 [8];
  istringstream input;
  CcsDomain local_18;
  CcsDomain ccs;
  CcsTest_InterpolationIsDoneAtLoadTime_Test *this_local;
  
  ccs.dag._M_t.super___uniq_ptr_impl<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>._M_t.
  super__Tuple_impl<0UL,_ccs::DagBuilder_*,_std::default_delete<ccs::DagBuilder>_>.
  super__Head_base<0UL,_ccs::DagBuilder_*,_false>._M_head_impl =
       (unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>)
       (unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>)this;
  ::ccs::CcsDomain::CcsDomain(&local_18,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"a = \'foo${VAR1} baz\'",&local_1b9);
  std::__cxx11::istringstream::istringstream(local_198,local_1b8,_S_in);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f0,"<literal>",
             (allocator *)
             ((long)&ctx.searchState.
                     super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  ::ccs::CcsDomain::loadCcsStream
            (&local_18,(istream *)local_198,&local_1f0,
             (ImportResolver *)&::ccs::(anonymous_namespace)::NoImportResolver);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ctx.searchState.
                     super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  ::ccs::CcsDomain::build((CcsDomain *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"a",&local_239);
  psVar2 = ::ccs::CcsContext::getString((CcsContext *)&gtest_ar.message_,&local_238);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_218,"\"foo baz\"","ctx.getString(\"a\")",(char (*) [8])"foo baz",
             psVar2);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xa8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  setenv("VAR1","bar",1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,"a",&local_281);
  psVar2 = ::ccs::CcsContext::getString((CcsContext *)&gtest_ar.message_,&local_280);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_260,"\"foo baz\"","ctx.getString(\"a\")",(char (*) [8])"foo baz",
             psVar2);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xaa,pcVar3);
    testing::internal::AssertHelper::operator=(&local_298,&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  unsetenv("VAR1");
  ::ccs::CcsContext::~CcsContext((CcsContext *)&gtest_ar.message_);
  std::__cxx11::istringstream::~istringstream(local_198);
  ::ccs::CcsDomain::~CcsDomain(&local_18);
  return;
}

Assistant:

TEST(CcsTest, InterpolationIsDoneAtLoadTime) {
  CcsDomain ccs;
  std::istringstream input("a = 'foo${VAR1} baz'");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext ctx = ccs.build();
  EXPECT_EQ("foo baz", ctx.getString("a"));
  setenv("VAR1", "bar", true);
  EXPECT_EQ("foo baz", ctx.getString("a"));
  unsetenv("VAR1");
}